

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Promise<void> kj::yieldUntilQueueEmpty(void)

{
  PromiseBase in_RDI;
  
  if (yieldUntilQueueEmpty()::NODE == '\0') {
    yieldUntilQueueEmpty();
  }
  *(YieldUntilQueueEmptyPromiseNode **)in_RDI.node.ptr = &yieldUntilQueueEmpty::NODE;
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yieldUntilQueueEmpty() {
  class YieldUntilQueueEmptyPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armLast();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yieldUntilQueueEmpty));
    }
  };

  static YieldUntilQueueEmptyPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}